

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_PostScript.cxx
# Opt level: O0

void __thiscall
Fl_PostScript_Graphics_Driver::vertex(Fl_PostScript_Graphics_Driver *this,double x,double y)

{
  double y_local;
  double x_local;
  Fl_PostScript_Graphics_Driver *this_local;
  
  if (this->shape_ == 4) {
    clocale_printf(this,"%g %g MT\n",x,y);
    this->gap_ = 1;
  }
  else if (this->gap_ == 0) {
    clocale_printf(this,"%g %g LT\n",x,y);
  }
  else {
    clocale_printf(this,"%g %g MT\n",x,y);
    this->gap_ = 0;
  }
  return;
}

Assistant:

void Fl_PostScript_Graphics_Driver::vertex(double x, double y){
  if(shape_==POINTS){
    clocale_printf("%g %g MT\n", x , y);
    gap_=1;
    return;
  }
  if(gap_){
    clocale_printf("%g %g MT\n", x , y);
    gap_=0;
  }else
    clocale_printf("%g %g LT\n", x , y);
}